

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O3

void region_erase_bordered(region_conflict *loc)

{
  wchar_t wVar1;
  wchar_t wVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  region_conflict rVar6;
  
  rVar6 = region_calculate(*loc);
  wVar2 = L'\x01';
  if (L'\x01' < rVar6.col) {
    wVar2 = rVar6.col;
  }
  wVar1 = L'\x01';
  if (L'\x01' < rVar6.row) {
    wVar1 = rVar6.row;
  }
  uVar4 = rVar6._8_8_ + 0x200000000;
  uVar5 = uVar4 >> 0x20;
  if ((int)(uVar4 >> 0x20) != 0 && -1 < (long)uVar4) {
    wVar1 = wVar1 + L'\xffffffff';
    do {
      Term_erase(wVar2 + L'\xffffffff',wVar1,rVar6.width + L'\x02');
      wVar1 = wVar1 + L'\x01';
      uVar3 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar3;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void region_erase_bordered(const region *loc)
{
	region calc = region_calculate(*loc);
	int i = 0;

	calc.col = MAX(calc.col - 1, 0);
	calc.row = MAX(calc.row - 1, 0);
	calc.width += 2;
	calc.page_rows += 2;

	for (i = 0; i < calc.page_rows; i++)
		Term_erase(calc.col, calc.row + i, calc.width);
}